

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O0

SPIRConstant * __thiscall
diligent_spirv_cross::Parser::
set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int_const*,unsigned_int,bool>
          (Parser *this,uint32_t id,uint *args,uint **args_1,uint *args_2,bool *args_3)

{
  Variant *var_00;
  TypedID<(diligent_spirv_cross::Types)0> local_4c;
  SPIRConstant *local_48;
  SPIRConstant *var;
  bool *local_38;
  bool *args_local_3;
  uint *args_local_2;
  uint **args_local_1;
  uint *args_local;
  Parser *pPStack_10;
  uint32_t id_local;
  Parser *this_local;
  
  local_38 = args_3;
  args_local_3 = (bool *)args_2;
  args_local_2 = (uint *)args_1;
  args_local_1 = (uint **)args;
  args_local._4_4_ = id;
  pPStack_10 = this;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID
            ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&var + 4),id);
  ParsedIR::add_typed_id(&this->ir,TypeConstant,var._4_4_);
  var_00 = VectorView<diligent_spirv_cross::Variant>::operator[]
                     (&(this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>,
                      (ulong)args_local._4_4_);
  local_48 = variant_set<diligent_spirv_cross::SPIRConstant,unsigned_int&,unsigned_int_const*,unsigned_int,bool>
                       (var_00,(uint *)args_local_1,(uint **)args_local_2,(uint *)args_local_3,
                        local_38);
  TypedID<(diligent_spirv_cross::Types)0>::TypedID(&local_4c,args_local._4_4_);
  (local_48->super_IVariant).self.id = local_4c.id;
  return local_48;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}